

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 uVar14;
  int iVar15;
  uint64_t uVar16;
  uint64_t id;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StructSchema union1g;
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition;
  DebugComparison<capnp::StructSchema_&,_capnp::Schema> _kjCondition_2;
  undefined1 local_e0;
  StructSchema schema;
  char *local_b8;
  Field u1f0s8;
  Field union1;
  
  _kjCondition.left.ptr.isSet = true;
  _kjCondition.left.ptr._1_7_ = 0x6eac;
  schema = Schema::asStruct((Schema *)&_kjCondition);
  name.content.size_ = 5;
  name.content.ptr = "bit0";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&schema,name);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  uVar14 = _kjCondition.left.ptr.field_1._32_1_;
  _kjCondition.result = (bool)(byte)_kjCondition_2.left;
  _kjCondition.left.ptr.field_1._32_1_ = local_e0;
  uVar11 = _kjCondition.left.ptr.field_1._32_1_;
  if ((byte)_kjCondition_2.left == '\x01') {
    auVar1[0xf] = 0;
    auVar1._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar1 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
    uVar14 = _kjCondition.left.ptr.field_1._32_1_;
  }
  _kjCondition.left.ptr.field_1._32_1_ = uVar14;
  _kjCondition.left.ptr.isSet = _kjCondition.result;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected schema.findFieldByName(\"bit0\") != kj::none",
               &_kjCondition);
  }
  name_00.content.size_ = 7;
  name_00.content.ptr = "u1f0s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&schema,name_00);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((bool)(byte)_kjCondition_2.left == true) {
    auVar2[0xf] = 0;
    auVar2._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar2 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
    _kjCondition.left.ptr.field_1._32_1_ = uVar11;
  }
  _kjCondition.result = (bool)(_kjCondition.left.ptr.isSet ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.left.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == kj::none\", _kjCondition"
               ,(char (*) [62])"failed: expected schema.findFieldByName(\"u1f0s8\") == kj::none",
               &_kjCondition);
  }
  name_01.content.size_ = 7;
  name_01.content.ptr = "union1";
  StructSchema::getFieldByName(&union1,&schema,name_01);
  if (union1.proto._reader.dataSize < 0xc0) {
    uVar16 = 0;
  }
  else {
    uVar16 = *(uint64_t *)((long)union1.proto._reader.data + 0x10);
  }
  id = 0;
  _kjCondition.left.ptr._0_8_ = Schema::getDependency(&schema.super_Schema,uVar16,0);
  union1g = Schema::asStruct((Schema *)&_kjCondition);
  Schema::getProto((Reader *)&_kjCondition,&union1g.super_Schema);
  if (0xbf < (uint)_kjCondition.left.ptr.field_1._24_4_) {
    id = *(uint64_t *)(_kjCondition.left.ptr.field_1._8_8_ + 0x10);
  }
  _kjCondition_2.right = Schema::getDependency(&union1g.super_Schema,id,0);
  _kjCondition_2.left = (StructSchema *)&schema.super_Schema;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.result = schema.super_Schema.raw == (Schema)_kjCondition_2.right.raw;
  _kjCondition_2.op.content.size_ = 5;
  if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&_kjCondition,&union1g.super_Schema);
    if ((uint)_kjCondition.left.ptr.field_1._24_4_ < 0xc0) {
      uVar16 = 0;
    }
    else {
      uVar16 = *(uint64_t *)(_kjCondition.left.ptr.field_1._8_8_ + 0x10);
    }
    u1f0s8.parent.super_Schema = Schema::getDependency(&union1g.super_Schema,uVar16,0);
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<capnp::StructSchema&,capnp::Schema>&,capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", _kjCondition, schema, union1g.getDependency(union1g.getProto().getScopeId())"
               ,(char (*) [86])
                "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
               ,&_kjCondition_2,(StructSchema *)&schema.super_Schema,(Schema *)&u1f0s8);
  }
  name_02.content.size_ = 5;
  name_02.content.ptr = "bin0";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_02);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  bVar12 = (bool)(byte)_kjCondition_2.left;
  if ((bool)(byte)_kjCondition_2.left == true) {
    auVar3[0xf] = 0;
    auVar3._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar3 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
    _kjCondition.left.ptr.field_1._32_1_ = uVar11;
  }
  _kjCondition.left.ptr.isSet = bVar12;
  _kjCondition.result = (bool)(bVar12 ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((bVar12 != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x74,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected union1g.findFieldByName(\"bin0\") == kj::none",
               &_kjCondition);
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f0s8";
  StructSchema::getFieldByName(&u1f0s8,&union1g,name_03);
  local_b8 = "u1f0s8";
  _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
       (StructSchema)u1f0s8.proto._reader.capTable;
  _kjCondition.left.ptr.field_1._8_8_ = u1f0s8.proto._reader.pointers;
  _kjCondition.left.ptr._0_8_ = u1f0s8.proto._reader.segment;
  iVar15 = u1f0s8.proto._reader.nestingLimit;
  if (u1f0s8.proto._reader.pointerCount == 0) {
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(RawBrandedSchema *)0x0;
    _kjCondition.left.ptr.field_1._8_8_ = (WirePointer *)0x0;
    _kjCondition.left.ptr._0_8_ = (SegmentReader *)0x0;
    iVar15 = 0x7fffffff;
  }
  _kjCondition.left.ptr.field_1._16_4_ = iVar15;
  _kjCondition_2._0_16_ =
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[7]> *)&local_b8,(Reader *)&_kjCondition_2);
  if ((_kjCondition.left.ptr.field_1._32_1_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    if (u1f0s8.proto._reader.pointerCount == 0) {
      u1f0s8.proto._reader.nestingLimit = 0x7fffffff;
      u1f0s8.proto._reader.capTable = (CapTableReader *)0x0;
      u1f0s8.proto._reader.pointers = (WirePointer *)0x0;
      u1f0s8.proto._reader.segment = (SegmentReader *)0x0;
    }
    _kjCondition_2.right.raw = (RawBrandedSchema *)u1f0s8.proto._reader.capTable;
    _kjCondition_2.left = (StructSchema *)u1f0s8.proto._reader.segment;
    _kjCondition_2.op.content.size_ =
         CONCAT44(_kjCondition_2.op.content.size_._4_4_,u1f0s8.proto._reader.nestingLimit);
    _kjCondition_2.op.content.ptr = (char *)u1f0s8.proto._reader.pointers;
    _kjCondition_2._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_2,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", _kjCondition, \"u1f0s8\", u1f0s8.getProto().getName()"
               ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
               (DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [7])"u1f0s8",(Reader *)&_kjCondition_2);
  }
  _kjCondition.left.ptr._0_8_ = u1f0s8.parent.super_Schema.raw;
  _kjCondition.left.ptr.field_1._8_8_ = anon_var_dwarf_3a16;
  _kjCondition.left.ptr.field_1.value.proto._reader.segment = (SegmentReader *)&DAT_00000005;
  _kjCondition.left.ptr.field_1._24_1_ = u1f0s8.parent.super_Schema.raw == union1g.super_Schema.raw;
  _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw = (StructSchema)&union1g;
  if ((u1f0s8.parent.super_Schema.raw != union1g.super_Schema.raw) &&
     (_kjCondition.left.ptr.field_1.value.parent.super_Schema.raw = (StructSchema)&union1g,
     kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw = (StructSchema)&union1g;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\", _kjCondition",
               (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)&_kjCondition);
  }
  name_04.content.size_ = 7;
  name_04.content.ptr = "u1f1s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_04);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.result = (bool)(byte)_kjCondition_2.left;
  if ((byte)_kjCondition_2.left == '\x01') {
    auVar4[0xf] = 0;
    auVar4._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar4 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.left.ptr.isSet = _kjCondition.result;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f1s8\") != kj::none",
               &_kjCondition);
  }
  name_05.content.size_ = 8;
  name_05.content.ptr = "u1f0s32";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_05);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((byte)_kjCondition_2.left == '\x01') {
    auVar5[0xf] = 0;
    auVar5._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar5 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left.ptr.isSet;
  if ((_kjCondition.left.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != kj::none\", _kjCondition"
               ,(char (*) [64])"failed: expected union1g.findFieldByName(\"u1f0s32\") != kj::none",
               &_kjCondition);
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u1f0sp";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_06);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((byte)_kjCondition_2.left == '\x01') {
    auVar6[0xf] = 0;
    auVar6._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar6 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left.ptr.isSet;
  if ((_kjCondition.left.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0sp\") != kj::none",
               &_kjCondition);
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "u1f1s1";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_07);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((byte)_kjCondition_2.left == '\x01') {
    auVar7[0xf] = 0;
    auVar7._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar7 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left.ptr.isSet;
  if ((_kjCondition.left.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7d,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f1s1\") != kj::none",
               &_kjCondition);
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "u0f0s1";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_08);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((byte)_kjCondition_2.left == 1) {
    auVar8[0xf] = 0;
    auVar8._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar8 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.result = (bool)(_kjCondition.left.ptr.isSet ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.left.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u0f0s1\") == kj::none",
               &_kjCondition);
  }
  name_09.content.size_ = 7;
  name_09.content.ptr = "u2f0s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_09);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((byte)_kjCondition_2.left == 1) {
    auVar9[0xf] = 0;
    auVar9._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar9 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.result = (bool)(_kjCondition.left.ptr.isSet ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.left.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u2f0s8\") == kj::none",
               &_kjCondition);
  }
  name_10.content.size_ = 0xc;
  name_10.content.ptr = "noSuchField";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&_kjCondition_2,&union1g,name_10);
  auVar13 = (undefined1  [16])_kjCondition_2._0_16_;
  _kjCondition.left.ptr.isSet = (bool)(byte)_kjCondition_2.left;
  if ((bool)(byte)_kjCondition_2.left == true) {
    auVar10[0xf] = 0;
    auVar10._0_15_ = (undefined1  [15])_kjCondition_2._1_15_;
    _kjCondition_2._0_16_ = auVar10 << 8;
    auVar1 = (undefined1  [16])_kjCondition_2._0_16_;
    _kjCondition_2.right.raw = auVar13._8_8_;
    _kjCondition.left.ptr.field_1.value.proto._reader.capTable =
         (CapTableReader *)CONCAT71(_kjCondition_2._33_7_,_kjCondition_2.result);
    _kjCondition.left.ptr.field_1.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)_kjCondition_2.right.raw;
    _kjCondition.left.ptr.field_1._8_8_ = _kjCondition_2.op.content.ptr;
    _kjCondition.left.ptr.field_1.value.proto._reader.segment =
         (SegmentReader *)_kjCondition_2.op.content.size_;
    _kjCondition_2._0_16_ = auVar1;
  }
  _kjCondition.result = (bool)(_kjCondition.left.ptr.isSet ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.left.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x81,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected union1g.findFieldByName(\"noSuchField\") == kj::none",
               &_kjCondition);
  }
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == kj::none);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == kj::none);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != kj::none);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == kj::none);
}